

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackRPMGenerator::PackageOnePack
          (cmCPackRPMGenerator *this,string *initialToplevel,string *packageName)

{
  cmCPackLog *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  cmAlphaNum local_240;
  string component_path;
  string outputFileName;
  string packageFileName;
  string localToplevel;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string((string *)&localToplevel,(string *)initialToplevel);
  cmsys::SystemTools::GetParentDirectory(&packageFileName,&(this->super_cmCPackGenerator).toplevel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"CPACK_PACKAGE_FILE_NAME",(allocator<char> *)&component_path);
  psVar3 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&local_240)
  ;
  if (psVar3 == (string *)0x0) {
    psVar3 = &cmValue::Empty_abi_cxx11_;
  }
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
            (&cmCPackLog_msg,this,psVar3,packageName,1);
  iVar2 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::operator+(&outputFileName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,(char *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&local_240);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",packageName);
  std::__cxx11::string::append((string *)&localToplevel);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&local_240);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,&localToplevel);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",&outputFileName);
  std::__cxx11::string::append((string *)&packageFileName);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_NAME",(allocator<char> *)&local_240);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,&outputFileName);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
             (allocator<char> *)&local_240);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,&packageFileName);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_RPM_PACKAGE_COMPONENT",(allocator<char> *)&local_240);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,(cmValue)packageName);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  _cmCPackLog_msg = (pointer)0x1;
  local_240.View_._M_str = (packageName->_M_dataplus)._M_p;
  local_240.View_._M_len = packageName->_M_string_length;
  cmStrCat<>(&component_path,(cmAlphaNum *)&cmCPackLog_msg,&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_RPM_PACKAGE_COMPONENT_PART_PATH",
             (allocator<char> *)&local_240);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,&component_path);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  bVar1 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackRPM.cmake");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Error while execution CPackRPM.cmake");
    std::endl<char,std::char_traits<char>>(poVar4);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                    ,0x5a,(char *)local_240.View_._M_len);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  }
  std::__cxx11::string::~string((string *)&component_path);
  std::__cxx11::string::~string((string *)&outputFileName);
  std::__cxx11::string::~string((string *)&packageFileName);
  std::__cxx11::string::~string((string *)&localToplevel);
  return (uint)bVar1;
}

Assistant:

int cmCPackRPMGenerator::PackageOnePack(std::string const& initialToplevel,
                                        std::string const& packageName)
{
  int retval = 1;
  // Begin the archive for this pack
  std::string localToplevel(initialToplevel);
  std::string packageFileName(
    cmSystemTools::GetParentDirectory(this->toplevel));
  std::string outputFileName(
    this->GetComponentPackageFileName(
      this->GetOption("CPACK_PACKAGE_FILE_NAME"), packageName, true) +
    this->GetOutputExtension());

  localToplevel += "/" + packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel);
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName);
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME", packageFileName);
  // Tell CPackRPM.cmake the name of the component NAME.
  this->SetOption("CPACK_RPM_PACKAGE_COMPONENT", packageName);
  // Tell CPackRPM.cmake the path where the component is.
  std::string component_path = cmStrCat('/', packageName);
  this->SetOption("CPACK_RPM_PACKAGE_COMPONENT_PART_PATH", component_path);
  if (!this->ReadListFile("Internal/CPack/CPackRPM.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackRPM.cmake" << std::endl);
    retval = 0;
  }

  return retval;
}